

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

uint * If_CluHashLookup(If_Man_t *p,word *pTruth,int t)

{
  If_Par_t *pIVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  Mem_Fixed_t *pMVar5;
  Vec_Ptr_t *p_00;
  void **ppvVar6;
  long *plVar7;
  void **ppvVar8;
  char *pcVar9;
  int iVar10;
  int nWords;
  long *plVar11;
  long lVar12;
  int i;
  uint *puVar13;
  int local_4c;
  
  if (p == (If_Man_t *)0x0) {
    puVar13 = (uint *)0x0;
  }
  else {
    iVar4 = p->pPars->nLutSize;
    nWords = 1 << ((char)iVar4 - 6U & 0x1f);
    if (iVar4 < 7) {
      nWords = 1;
    }
    if (p->pMemEntries == (Mem_Fixed_t *)0x0) {
      pMVar5 = Mem_FixedStart(nWords * 8 + 0x10);
      p->pMemEntries = pMVar5;
    }
    ppvVar6 = p->pHashTable[t];
    if (ppvVar6 == (void **)0x0) {
      pIVar1 = p->pPars;
      uVar3 = If_CluPrimeCudd(pIVar1->nCutsMax * p->vObjs->nSize);
      iVar4 = pIVar1->nLutSize;
      iVar10 = 1 << ((char)iVar4 - 6U & 0x1f);
      if (iVar4 < 7) {
        iVar10 = 1;
      }
      iVar10 = (int)((1048576000.0 / (double)iVar10) * 0.125);
      iVar4 = uVar3 * 4;
      if (iVar10 <= (int)(uVar3 * 4)) {
        iVar4 = iVar10;
      }
      uVar3 = If_CluPrimeCudd(iVar4 / 2);
      p->nTableSize[t] = uVar3;
      ppvVar6 = (void **)calloc((long)(int)uVar3,8);
      p->pHashTable[t] = ppvVar6;
    }
    else {
      uVar3 = p->nTableSize[t];
    }
    local_4c = If_CluHashKey(pTruth,nWords,uVar3);
    lVar12 = (long)local_4c;
    ppvVar6 = ppvVar6 + lVar12;
    while (ppvVar6 = (void **)*ppvVar6, ppvVar6 != (void **)0x0) {
      iVar4 = bcmp(ppvVar6 + 2,pTruth,(long)nWords << 3);
      if (iVar4 == 0) {
        *(int *)((long)ppvVar6 + 0xc) = *(int *)((long)ppvVar6 + 0xc) + 1;
        return (uint *)(ppvVar6 + 1);
      }
    }
    iVar4 = p->nTableEntries[t];
    if (SBORROW4(iVar4,uVar3 * 2) == (int)(iVar4 + uVar3 * -2) < 0) {
      p_00 = (Vec_Ptr_t *)malloc(0x10);
      iVar10 = 8;
      if (6 < iVar4 - 1U) {
        iVar10 = iVar4;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar10;
      if (iVar10 == 0) {
        ppvVar6 = (void **)0x0;
      }
      else {
        ppvVar6 = (void **)malloc((long)iVar10 << 3);
      }
      p_00->pArray = ppvVar6;
      iVar4 = If_CluHashFindMedian(p,t);
      lVar12 = 0;
      while( true ) {
        if (p->nTableSize[t] <= lVar12) break;
        pcVar9 = (char *)p->pHashTable[t][lVar12];
        while (pcVar9 != (char *)0x0) {
          if (iVar4 < *(int *)(pcVar9 + 0xc)) {
            iVar10 = p_00->nSize;
            if (iVar10 == p_00->nCap) {
              uVar3 = iVar10 * 2;
              if (iVar10 < 0x10) {
                uVar3 = 0x10;
              }
              ppvVar6 = p_00->pArray;
              if (iVar10 < (int)uVar3) {
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar3 << 3);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar3 << 3);
                }
                p_00->pArray = ppvVar6;
                p_00->nCap = uVar3;
              }
            }
            else {
              ppvVar6 = p_00->pArray;
            }
            p_00->nSize = iVar10 + 1;
            ppvVar6[iVar10] = pcVar9;
            pcVar9 = *(char **)pcVar9;
          }
          else {
            pcVar2 = *(char **)pcVar9;
            Mem_FixedEntryRecycle(p->pMemEntries,pcVar9);
            pcVar9 = pcVar2;
          }
        }
        lVar12 = lVar12 + 1;
      }
      i = 0;
      memset(p->pHashTable[t],0,(long)p->nTableSize[t] << 3);
      iVar4 = p_00->nSize;
      iVar10 = 0;
      if (0 < iVar4) {
        iVar10 = iVar4;
      }
      for (; i != iVar10; i = i + 1) {
        plVar7 = (long *)Vec_PtrEntry(p_00,i);
        local_4c = If_CluHashKey((word *)(plVar7 + 2),nWords,p->nTableSize[t]);
        ppvVar6 = (void **)p->pHashTable[t][local_4c];
        if ((ppvVar6 == (void **)0x0) ||
           (*(uint *)((long)ppvVar6 + 0xc) <= *(uint *)((long)plVar7 + 0xc))) {
          *plVar7 = (long)ppvVar6;
          ppvVar8 = p->pHashTable[t] + local_4c;
        }
        else {
          do {
            ppvVar8 = ppvVar6;
            ppvVar6 = (void **)*ppvVar8;
            if (ppvVar6 == (void **)0x0) break;
          } while (*(uint *)((long)plVar7 + 0xc) < *(uint *)((long)ppvVar6 + 0xc));
          *plVar7 = (long)ppvVar6;
        }
        *ppvVar8 = plVar7;
      }
      p->nTableEntries[t] = iVar4;
      free(p_00->pArray);
      free(p_00);
      iVar4 = p->nTableEntries[t];
      lVar12 = (long)local_4c;
    }
    p->nTableEntries[t] = iVar4 + 1;
    pcVar9 = Mem_FixedEntryFetch(p->pMemEntries);
    memcpy(pcVar9 + 0x10,pTruth,(long)nWords << 3);
    pcVar9[8] = -1;
    pcVar9[9] = '\0';
    pcVar9[10] = '\0';
    pcVar9[0xb] = '\0';
    pcVar9[0xc] = '\x01';
    pcVar9[0xd] = '\0';
    pcVar9[0xe] = '\0';
    pcVar9[0xf] = '\0';
    pcVar9[0] = '\0';
    pcVar9[1] = '\0';
    pcVar9[2] = '\0';
    pcVar9[3] = '\0';
    pcVar9[4] = '\0';
    pcVar9[5] = '\0';
    pcVar9[6] = '\0';
    pcVar9[7] = '\0';
    puVar13 = (uint *)(pcVar9 + 8);
    plVar7 = (long *)p->pHashTable[t][lVar12];
    do {
      plVar11 = plVar7;
      if (plVar11 == (long *)0x0) {
        p->pHashTable[t][lVar12] = pcVar9;
        return puVar13;
      }
      plVar7 = (long *)*plVar11;
    } while ((long *)*plVar11 != (long *)0x0);
    *plVar11 = (long)pcVar9;
  }
  return puVar13;
}

Assistant:

unsigned * If_CluHashLookup( If_Man_t * p, word * pTruth, int t )
{
    If_Hte_t * pEntry, * pPrev;
    int nWords, HashKey;
    if ( p == NULL )
        return NULL;
    nWords = If_CluWordNum(p->pPars->nLutSize);
    if ( p->pMemEntries == NULL )
        p->pMemEntries = Mem_FixedStart( sizeof(If_Hte_t) + sizeof(word) * (If_CluWordNum(p->pPars->nLutSize) - 1) );
    if ( p->pHashTable[t] == NULL )
    {
        // decide how large should be the table
        int nEntriesMax1 = 4 * If_CluPrimeCudd( Vec_PtrSize(p->vObjs) * p->pPars->nCutsMax );
        int nEntriesMax2 = (int)(((double)CLU_MEM_MAX * (1 << 20)) / If_CluWordNum(p->pPars->nLutSize) / 8);
//        int nEntriesMax2 = 10000;
        // create table
        p->nTableSize[t] = If_CluPrimeCudd( Abc_MinInt(nEntriesMax1, nEntriesMax2)/2 );
        p->pHashTable[t] = ABC_CALLOC( void *, p->nTableSize[t] );
    }
    // check if this entry exists
    HashKey = If_CluHashKey( pTruth, nWords, p->nTableSize[t] );
    for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pEntry; pEntry = pEntry->pNext )
        if ( memcmp(pEntry->pTruth, pTruth, sizeof(word) * nWords) == 0 )
        {
            pEntry->Counter++;
            return &pEntry->Group;
        }
    // resize the hash table
    if ( p->nTableEntries[t] >= 2 * p->nTableSize[t] )
    {
        // collect useful entries
        If_Hte_t * pPrev;
        Vec_Ptr_t * vUseful = Vec_PtrAlloc( p->nTableEntries[t] );
        int i, Median = If_CluHashFindMedian( p, t );
        for ( i = 0; i < p->nTableSize[t]; i++ )
        {
            for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; )
            {
                if ( (int)pEntry->Counter > Median )
                {
                    Vec_PtrPush( vUseful, pEntry );
                    pEntry = pEntry->pNext;
                }
                else
                {
                    pPrev = pEntry->pNext;
                    Mem_FixedEntryRecycle( p->pMemEntries, (char *)pEntry );
                    pEntry = pPrev;
                }
            }
        }
        // add useful entries
        memset( p->pHashTable[t], 0, sizeof(void *) * p->nTableSize[t] );
        Vec_PtrForEachEntry( If_Hte_t *, vUseful, pEntry, i )
        {
            HashKey = If_CluHashKey( pEntry->pTruth, nWords, p->nTableSize[t] );
            pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey];
            if ( pPrev == NULL || pEntry->Counter >= pPrev->Counter )
            {
                pEntry->pNext = pPrev;
                ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
            }
            else
            {
                while ( pPrev->pNext && pEntry->Counter < pPrev->pNext->Counter )
                    pPrev = pPrev->pNext;
                pEntry->pNext = pPrev->pNext;
                pPrev->pNext = pEntry;
            }
        }
        p->nTableEntries[t] = Vec_PtrSize( vUseful );
        Vec_PtrFree( vUseful );
    }
    // create entry
    p->nTableEntries[t]++;
    pEntry = (If_Hte_t *)Mem_FixedEntryFetch( p->pMemEntries );
    memcpy( pEntry->pTruth, pTruth, sizeof(word) * nWords );
    pEntry->Group = CLU_UNUSED;
    pEntry->Counter = 1;
    // insert at the beginning
//    pEntry->pNext = ((If_Hte_t **)p->pHashTable[t])[HashKey];
//    ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    // insert at the end
    pEntry->pNext = NULL;
    for ( pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pPrev && pPrev->pNext; pPrev = pPrev->pNext );
    if ( pPrev == NULL )
        ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    else
        pPrev->pNext = pEntry;
    return &pEntry->Group;
}